

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_helper.c
# Opt level: O0

int nghttp2_increase_local_window_size
              (int32_t *local_window_size_ptr,int32_t *recv_window_size_ptr,
              int32_t *recv_reduction_ptr,int32_t *delta_ptr)

{
  int b;
  int32_t iVar1;
  int *in_RCX;
  int32_t *in_RDX;
  int *in_RSI;
  int *in_RDI;
  int32_t delta;
  int32_t recv_reduction_delta;
  int local_4;
  
  b = *in_RCX;
  if (-1 < b) {
    if (0x7fffffff - b < *in_RDI) {
      local_4 = -0x20c;
    }
    else {
      *in_RDI = b + *in_RDI;
      iVar1 = nghttp2_min_int32(*in_RDX,b);
      *in_RDX = *in_RDX - iVar1;
      *in_RSI = iVar1 + *in_RSI;
      *in_RCX = *in_RCX - iVar1;
      local_4 = 0;
    }
    return local_4;
  }
  __assert_fail("delta >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_helper.c"
                ,0xe1,
                "int nghttp2_increase_local_window_size(int32_t *, int32_t *, int32_t *, int32_t *)"
               );
}

Assistant:

int nghttp2_increase_local_window_size(int32_t *local_window_size_ptr,
                                       int32_t *recv_window_size_ptr,
                                       int32_t *recv_reduction_ptr,
                                       int32_t *delta_ptr) {
  int32_t recv_reduction_delta;
  int32_t delta;

  delta = *delta_ptr;

  assert(delta >= 0);

  /* The delta size is strictly more than received bytes. Increase
     local_window_size by that difference |delta|. */
  if (*local_window_size_ptr > NGHTTP2_MAX_WINDOW_SIZE - delta) {
    return NGHTTP2_ERR_FLOW_CONTROL;
  }

  *local_window_size_ptr += delta;
  /* If there is recv_reduction due to earlier window_size
     reduction, we have to adjust it too. */
  recv_reduction_delta = nghttp2_min_int32(*recv_reduction_ptr, delta);
  *recv_reduction_ptr -= recv_reduction_delta;

  *recv_window_size_ptr += recv_reduction_delta;

  /* recv_reduction_delta must be paid from *delta_ptr, since it was
     added in window size reduction (see below). */
  *delta_ptr -= recv_reduction_delta;

  return 0;
}